

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

string * __thiscall
wabt::LoadStoreTracking::GenAlign_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Address align,Opcode opc)

{
  char cVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char cVar4;
  string __str;
  Opcode local_44;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,opc.enum_);
  local_44.enum_ = opc.enum_;
  bVar2 = Opcode::IsNaturallyAligned(&local_44,align);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cVar4 = '\x01';
    if (9 < align) {
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)align;
      cVar1 = '\x04';
      do {
        cVar4 = cVar1;
        if (args_1 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64) {
          cVar4 = cVar4 + -2;
          goto LAB_00132e20;
        }
        if (args_1 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e8) {
          cVar4 = cVar4 + -1;
          goto LAB_00132e20;
        }
        if (args_1 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2710)
        goto LAB_00132e20;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)args_1 / 10000);
        bVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1869f <
                args_1;
        args_1 = pbVar3;
        cVar1 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00132e20:
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,align);
    cat<char[2],std::__cxx11::string>
              (__return_storage_ptr__,(wabt *)"@",(char (*) [2])&local_40,args_1);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAlign(Address align, Opcode opc) const {
    return opc.IsNaturallyAligned(align) ? "" : cat("@", std::to_string(align));
  }